

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall
QWidgetPrivate::updateBrushOrigin(QWidgetPrivate *this,QPainter *painter,QBrush *brush)

{
  uint uVar1;
  QWidget *pQVar2;
  QAbstractScrollArea *this_00;
  QWidget *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(*(long *)brush + 4);
  if (1 < uVar1) {
    pQVar2 = *(QWidget **)&this->field_0x8;
    this_00 = (QAbstractScrollArea *)
              QtPrivate::qobject_cast_helper<QAbstractScrollArea*,QObject>
                        (*(QObject **)&this->field_0x10);
    if (this_00 != (QAbstractScrollArea *)0x0) {
      pQVar3 = QAbstractScrollArea::viewport(this_00);
      if (pQVar3 == pQVar2) {
        uVar4 = (**(code **)(**(long **)(this_00 + 8) + 0xb8))();
        local_30 = (QPoint)((ulong)(uint)-(int)uVar4 - (uVar4 & 0xffffffff00000000));
        QPainter::setBrushOrigin(painter,&local_30);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return 1 < uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::updateBrushOrigin(QPainter *painter, const QBrush &brush) const
{
#if QT_CONFIG(scrollarea)
    Q_Q(const QWidget);
    //If we are painting the viewport of a scrollarea, we must apply an offset to the brush in case we are drawing a texture
    if (brush.style() == Qt::NoBrush || brush.style() == Qt::SolidPattern)
        return false;
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent);
    if (scrollArea && scrollArea->viewport() == q) {
        QObjectData *scrollPrivate = static_cast<QWidget *>(scrollArea)->d_ptr.data();
        QAbstractScrollAreaPrivate *priv = static_cast<QAbstractScrollAreaPrivate *>(scrollPrivate);
        painter->setBrushOrigin(-priv->contentsOffset());
    }
#endif // QT_CONFIG(scrollarea)
    return true;
}